

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void max_cb(Fl_Value_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  Fl_Widget_Type *q;
  Fl_Type *o;
  double n;
  int mod;
  void *v_local;
  Fl_Value_Input *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar2 == 0) {
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1d])();
      if (iVar2 == 0) {
        Fl_Widget::deactivate((Fl_Widget *)i);
      }
      else {
        Fl_Widget::activate((Fl_Widget *)i);
        dVar3 = Fl_Spinner::maximum((Fl_Spinner *)current_widget->o);
        Fl_Valuator::value(&i->super_Fl_Valuator,dVar3);
      }
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      dVar3 = Fl_Valuator::maximum((Fl_Valuator *)current_widget->o);
      Fl_Valuator::value(&i->super_Fl_Valuator,dVar3);
    }
  }
  else {
    bVar1 = false;
    dVar3 = Fl_Valuator::value(&i->super_Fl_Valuator);
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x1c])();
        if (iVar2 == 0) {
          iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x1d])();
          if (iVar2 != 0) {
            Fl_Spinner::maximum((Fl_Spinner *)q->o,dVar3);
            Fl_Widget::redraw(q->o);
            bVar1 = true;
          }
        }
        else {
          Fl_Valuator::maximum((Fl_Valuator *)q->o,dVar3);
          Fl_Widget::redraw(q->o);
          bVar1 = true;
        }
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void max_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_valuator()) {
      i->activate();
      i->value(((Fl_Valuator*)(current_widget->o))->maximum());
    } else if (current_widget->is_spinner()) {
      i->activate();
      i->value(((Fl_Spinner*)(current_widget->o))->maximum());
    } else {
      i->deactivate();
      return;
    }
  } else {
    int mod = 0;
    double n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	if (q->is_valuator()) {
	  ((Fl_Valuator*)(q->o))->maximum(n);
	  q->o->redraw();
	  mod = 1;
        } else if (q->is_spinner()) {
          ((Fl_Spinner*)(q->o))->maximum(n);
          q->o->redraw();
          mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}